

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void __thiscall f8n::db::Statement::BindTextW(Statement *this,int position,wstring *bindText)

{
  sqlite3_stmt *pStmt;
  void *zData;
  wstring *bindText_local;
  int position_local;
  Statement *this_local;
  
  pStmt = this->stmt;
  zData = (void *)std::__cxx11::wstring::c_str();
  sqlite3_bind_text16(pStmt,position + 1,zData,-1,(_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

void Statement::BindTextW(int position, const std::wstring &bindText) {
    sqlite3_bind_text16(
        this->stmt,
        position + 1,
        bindText.c_str(),
        -1,
        SQLITE_TRANSIENT);
}